

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O2

void __thiscall
NaPNStatistics::configure_output(NaPNStatistics *this,char *szStatMask,char *szDelim)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  undefined8 in_RAX;
  size_t sVar4;
  char *szStatText;
  uint uVar5;
  uint uVar6;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT71((int7)((ulong)in_RAX >> 8),szStatMask == (char *)0x0);
  if (szDelim != (char *)0x0 && szStatMask != (char *)0x0) {
    uStack_40 = 0x14142d;
    sVar4 = strlen(szStatMask);
    lVar2 = -(sVar4 + 0x10 & 0xfffffffffffffff0);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x141449;
    strcpy((char *)((long)&uStack_38 + lVar2),szStatMask);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x141454;
    szStatText = strtok((char *)((long)&uStack_38 + lVar2),szDelim);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 1;
    uVar1 = *(undefined8 *)((long)&uStack_40 + lVar2);
    uVar6 = 0;
    while (szStatText != (char *)0x0) {
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x14146b;
      iVar3 = NaStatTextToId(szStatText);
      uVar5 = (int)uVar1 << ((byte)iVar3 & 0x1f);
      if (iVar3 == -1) {
        uVar5 = 0;
      }
      uVar6 = uVar6 | uVar5;
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x141486;
      szStatText = strtok((char *)0x0,szDelim);
    }
    if (uVar6 != 0) {
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x141495;
      NaPetriNode::check_tunable(&this->super_NaPetriNode);
      this->mOutStat = uVar6;
    }
  }
  return;
}

Assistant:

void
NaPNStatistics::configure_output (const char* szStatMask, const char* szDelim)
{
    if(NULL == szStatMask || NULL == szDelim)
	return;

    char *token, *statmask = (char*)alloca(strlen(szStatMask) + 1);
    int resmask = 0;

    strcpy(statmask, szStatMask);

    for(token = strtok(statmask, szDelim); NULL != token;
	token = strtok(NULL, szDelim))
	{
	    int	id = NaStatTextToId(token);

	    if(id != NaSI_bad_id)
		resmask |= NaSIdToMask(id);
	}
    if(0 != resmask)
	configure_output(resmask);
}